

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decrypt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  ostream *poVar3;
  int __oflag;
  uint uVar4;
  ofstream FileOut;
  ifstreambuf FileIn;
  
  if (argc < 3) {
    puts(
        "Decrypt user-created .sai files:\n\tDecrypt.exe (filename) (output)\n\tWunkolo - Wunkolo@gmail.com"
        );
    uVar4 = 1;
  }
  else {
    sai::ifstreambuf::ifstreambuf(&FileIn,(span<const_unsigned_int,_256UL>)0x103114);
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              ((path *)&FileOut,argv + 1,auto_format);
    sai::ifstreambuf::open(&FileIn,(char *)&FileOut,__oflag);
    std::filesystem::__cxx11::path::~path((path *)&FileOut);
    bVar1 = sai::ifstreambuf::is_open(&FileIn);
    if (bVar1) {
      std::ofstream::ofstream(&FileOut);
      std::ofstream::open((char *)&FileOut,(_Ios_Openmode)argv[2]);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        poVar3 = std::operator<<((ostream *)&std::cout,"Error opening file for writing: ");
        poVar3 = std::operator<<(poVar3,argv[2]);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"File decrypted in:");
        std::chrono::_V2::system_clock::now();
        std::ostream::operator<<((ostream *)&FileOut,&FileIn.super_streambuf);
        std::chrono::_V2::system_clock::now();
        poVar3 = std::ostream::_M_insert<long>((long)poVar3);
        poVar3 = std::operator<<(poVar3,"ns");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      uVar4 = (uint)(cVar2 == '\0');
      std::ofstream::~ofstream(&FileOut);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Error opening file for reading: ");
      poVar3 = std::operator<<(poVar3,argv[1]);
      std::endl<char,std::char_traits<char>>(poVar3);
      uVar4 = 1;
    }
    sai::ifstreambuf::~ifstreambuf(&FileIn);
  }
  return uVar4;
}

Assistant:

int main(int argc, char* argv[])
{
	if( argc < 3 )
	{
		puts(Help);
		return EXIT_FAILURE;
	}

	sai::ifstreambuf FileIn;
	FileIn.open(argv[1]);

	if( !FileIn.is_open() )
	{
		std::cout << "Error opening file for reading: " << argv[1] << std::endl;
		return EXIT_FAILURE;
	}

	std::ofstream FileOut;
	FileOut.open(argv[2], std::ios::binary);

	if( !FileOut.is_open() )
	{
		std::cout << "Error opening file for writing: " << argv[2] << std::endl;
		return EXIT_FAILURE;
	}

	std::cout << "File decrypted in:" << Benchmark<std::chrono::nanoseconds>::Run([&]() -> void {
											 FileOut << &FileIn;
										 }).count()
			  << "ns" << std::endl;

	return EXIT_SUCCESS;
}